

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommon.cpp
# Opt level: O0

void __thiscall ODDLParser::Text::set(Text *this,char *buffer,size_t numChars)

{
  char *pcVar1;
  size_t numChars_local;
  char *buffer_local;
  Text *this_local;
  
  clear(this);
  if (numChars != 0) {
    this->m_len = numChars;
    this->m_capacity = this->m_len + 1;
    pcVar1 = (char *)operator_new__(this->m_capacity);
    this->m_buffer = pcVar1;
    strncpy(this->m_buffer,buffer,numChars);
    this->m_buffer[numChars] = '\0';
  }
  return;
}

Assistant:

void Text::set(const char *buffer, size_t numChars) {
    clear();
    if (numChars > 0) {
        m_len = numChars;
        m_capacity = m_len + 1;
        m_buffer = new char[m_capacity];
        strncpy(m_buffer, buffer, numChars);
        m_buffer[numChars] = '\0';
    }
}